

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O1

void __thiscall CTPNAnonFunc::gen_code(CTPNAnonFunc *this,int discard,int param_2)

{
  uint uVar1;
  CTcGenTarg *pCVar2;
  uint16_t tmp_1;
  int iVar3;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  uint16_t tmp;
  CTcCodeBodyCtx *pCVar4;
  uint uVar5;
  int our_varnum;
  char buf_1 [2];
  char buf_2 [2];
  char buf [4];
  undefined1 local_3e;
  undefined1 local_3d;
  int local_3c;
  undefined2 local_38;
  undefined2 local_36;
  undefined4 local_34;
  
  if (discard != 0) {
    return;
  }
  pCVar4 = (((this->super_CTPNAnonFuncBase).code_body_)->super_CTPNCodeBodyBase).ctx_tail_;
  uVar5 = 0;
  if (pCVar4 != (CTcCodeBodyCtx *)0x0) {
    do {
      iVar3 = CTPNCodeBodyBase::get_ctx_var_for_level
                        (&G_cs->code_body_->super_CTPNCodeBodyBase,pCVar4->level_ + -1,&local_3c);
      if (iVar3 == 0) {
        if (((((this->super_CTPNAnonFuncBase).code_body_)->super_CTPNCodeBodyBase).field_0xb9 & 4)
            != 0) {
          CTcGenTarg::write_op(G_cg,'\b');
          pCVar2 = G_cg;
          iVar3 = G_cg->sp_depth_;
          uVar1 = iVar3 + 1;
          in_RCX = (size_t)uVar1;
          G_cg->sp_depth_ = uVar1;
          if (pCVar2->max_sp_depth_ <= iVar3) {
            pCVar2->max_sp_depth_ = uVar1;
          }
        }
      }
      else {
        CTcSymLocal::s_gen_code_getlcl(local_3c,0);
      }
      uVar5 = uVar5 + 1;
      pCVar4 = pCVar4->prv_;
    } while (pCVar4 != (CTcCodeBodyCtx *)0x0);
  }
  if ((G_cg->field_0xd0 & 4) == 0) {
    CTcGenTarg::write_op(G_cg,'\v');
    CTPNCodeBodyBase::add_abs_fixup
              (&((this->super_CTPNAnonFuncBase).code_body_)->super_CTPNCodeBodyBase,
               &G_cs->super_CTcDataStream);
    local_34 = 0;
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_34,(void *)0x4,in_RCX);
  }
  else {
    CTcGenTarg::write_op(G_cg,'\a');
    CTcDataStream::write_obj_id
              (&G_cs->super_CTcDataStream,
               (ulong)(((this->super_CTPNAnonFuncBase).code_body_)->super_CTPNCodeBodyBase).
                      super_CTPNStmTop.dyn_obj_id_);
  }
  pCVar2 = G_cg;
  uVar1 = G_cg->sp_depth_;
  __n = (size_t)uVar1;
  G_cg->sp_depth_ = uVar1 + 1;
  if (pCVar2->max_sp_depth_ <= (int)uVar1) {
    pCVar2->max_sp_depth_ = uVar1 + 1;
  }
  if ((uVar5 != 0) ||
     (((((this->super_CTPNAnonFuncBase).code_body_)->super_CTPNCodeBodyBase).field_0xb8 & 8) != 0))
  {
    if (uVar5 < 0xff) {
      CTcGenTarg::write_op(pCVar2,0xc0);
      local_3e = (undefined1)(uVar5 + 1);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_3e,(void *)0x1,__n);
      local_3d = (undefined1)G_cg->predef_meta_idx_[5];
      iVar3 = (int)&local_3d;
      __buf = (void *)0x1;
    }
    else {
      CTcGenTarg::write_op(pCVar2,0xc1);
      local_38 = (undefined2)(uVar5 + 1);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_38,(void *)0x2,__n);
      local_36 = (undefined2)G_cg->predef_meta_idx_[5];
      iVar3 = (int)&local_36;
      __buf = (void *)0x2;
    }
    CTcDataStream::write(&G_cs->super_CTcDataStream,iVar3,__buf,__n);
    CTcGenTarg::write_op(G_cg,0x8b);
    G_cg->sp_depth_ = G_cg->sp_depth_ - uVar5;
  }
  return;
}

Assistant:

void CTPNAnonFunc::gen_code(int discard, int)
{
    /* if we're discarding the value, don't bother generating the code */
    if (discard)
        return;

    /* 
     *   Push each context object - these are the additional arguments to
     *   the anonymous function pointer object's constructor beyond the
     *   function pointer itself.  Note that we must push the arguments in
     *   reverse order of our list, since arguments are always pushed from
     *   last to first.  
     */
    int argc = 0;
    for (CTcCodeBodyCtx *cur_ctx = code_body_->get_ctx_tail() ; cur_ctx != 0 ;
         cur_ctx = cur_ctx->prv_, ++argc)
    {
        /* 
         *   find our context matching this context - the caller's
         *   contexts are all one level lower than the callee's contexts,
         *   because the caller is at the next recursion level out 
         */
        int our_varnum;
        if (G_cs->get_code_body()
            ->get_ctx_var_for_level(cur_ctx->level_ - 1, &our_varnum))
        {
			/* 
			 *   push this context object - to do this, simply retrieve the
			 *   value of the local variable in our frame that contains this
			 *   context level 
			 */
			CTcSymLocal::s_gen_code_getlcl(our_varnum, FALSE);
		}
		else if (code_body_->is_anon_method())
		{
			/* 
			 *   anonymous methods don't use context variables, since they
			 *   use the live method context 
			 */
			G_cg->write_op(OPC_PUSHNIL);
			G_cg->note_push();
		}
		else
		{
			/* 
			 *   If this is an anonymous function (rather than an anonymous
			 *   method), we require the context variable.  Anonymous methods
			 *   don't use these.
			 */
			assert(FALSE);
		}
    }

    /* 
     *   The first argument (and thus last pushed) to the constructor is the
     *   constant function pointer that refers to the code of the anonymous
     *   function.
     *   
     *   For regular static compilation, the function pointer is a simple
     *   code offset constant.  For run-time compilation (in the debugger or
     *   interpreter "eval()" facility), it's a DynamicFunc representing the
     *   dynamically compiled code.  
     */
    if (G_cg->is_eval_for_dyn())
    {
        /* 
         *   Dynamic (run-time) compilation - the bytecode is in a
         *   dynamically created DynamicFunc instance.  The dynamic compiler
         *   assigns object IDs for the anonymous function code body before
         *   generating any code for any referencing object, so we simply
         *   generate a PUSHOBJ for the code body's object ID. 
         */
        G_cg->write_op(OPC_PUSHOBJ);
        G_cs->write_obj_id(code_body_->get_dyn_obj_id());
    }
    else
    {
        /* conventional static compiler - the bytecode is in the code pool */
        G_cg->write_op(OPC_PUSHFNPTR);
        code_body_->add_abs_fixup(G_cs);
        G_cs->write4(0);
    }

    /* count the argument */
    ++argc;

    /* note the push of the function pointer argument */
    G_cg->note_push();

    /*
     *   If we have a local context, we need to create an anonymous function
     *   metaclass object that combines the function pointer with the local
     *   context.  If we don't have a local context, this is a simple static
     *   function that we can call directly, in which case we're already done
     *   since we've pushed the function pointer.  
     */
    if (argc > 1 || code_body_->has_local_ctx())
    {
        /* 
         *   We have a local context, so we need create to create the
         *   anonymous function metaclass object.  Generate the NEW.  
         */
        if (argc <= 255)
        {
            G_cg->write_op(OPC_NEW1);
            G_cs->write((char)argc);
            G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_ANONFN));
        }
        else
        {
            G_cg->write_op(OPC_NEW2);
            G_cs->write2(argc);
            G_cs->write2(G_cg->get_predef_meta_idx(TCT3_METAID_ANONFN));
        }
        
        /* push the object value */
        G_cg->write_op(OPC_GETR0);

        /* the 'new' popped the arguments, then we pushed the result */
        G_cg->note_pop(argc - 1);
    }
}